

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# convolution_1x1_pack1to4.h
# Opt level: O0

void ncnn::conv1x1s2_sgemm_pack1to4_sse
               (Mat *bottom_blob,Mat *top_blob,Mat *kernel,Mat *_bias,Option *opt)

{
  long in_RSI;
  long *in_RDI;
  int j;
  int i;
  float *outptr;
  float *r0;
  int p;
  Mat bottom_blob_shrinked;
  int tailstep;
  int outh;
  int outw;
  int elempack;
  size_t elemsize;
  int channels;
  int w;
  Mat *m_1;
  Mat *m;
  undefined8 in_stack_fffffffffffffc80;
  size_t in_stack_fffffffffffffc88;
  undefined8 in_stack_fffffffffffffc90;
  undefined8 in_stack_fffffffffffffc98;
  Mat *in_stack_fffffffffffffca0;
  int local_320;
  int local_31c;
  undefined8 local_318;
  Option *in_stack_fffffffffffffcf0;
  Mat *in_stack_fffffffffffffcf8;
  undefined4 uVar1;
  Mat *in_stack_fffffffffffffd00;
  Mat *in_stack_fffffffffffffd08;
  undefined4 in_stack_fffffffffffffd10;
  undefined4 in_stack_fffffffffffffd14;
  undefined4 *local_2d0;
  undefined8 local_2c8;
  undefined8 local_2c0;
  undefined8 local_2b8;
  undefined4 local_2b0;
  long local_2a8;
  undefined4 local_2a0;
  undefined4 local_29c;
  undefined4 local_298;
  undefined4 local_294;
  undefined4 local_290;
  undefined8 local_288;
  undefined4 *local_280;
  int local_278;
  void *local_268;
  int *local_260;
  long local_258;
  undefined4 local_250;
  Mat *local_248;
  undefined4 local_240;
  int local_23c;
  int local_238;
  undefined4 local_234;
  undefined4 local_230;
  long local_228;
  int local_220;
  int local_21c;
  int local_218;
  undefined4 local_214;
  long local_210;
  int local_208;
  int local_204;
  long *local_1e0;
  void **local_1d8;
  undefined8 *local_1d0;
  undefined8 *local_1c0;
  void **local_1b0;
  int local_190;
  undefined4 local_18c;
  void **local_188;
  undefined8 *local_168;
  undefined8 *local_148;
  undefined1 local_13d;
  int local_13c;
  void **local_138;
  undefined8 *local_130;
  undefined8 *local_110;
  undefined8 *local_108;
  undefined1 local_fd;
  int local_fc;
  undefined8 *local_f0;
  void *local_a0;
  long local_90;
  undefined4 local_84;
  long local_80;
  undefined4 *local_78;
  undefined4 local_6c;
  int local_68;
  int local_64;
  undefined8 *local_60;
  Mat *local_58;
  undefined4 local_4c;
  long local_48;
  undefined4 *local_40;
  undefined4 local_34;
  int local_30;
  int local_2c;
  undefined8 *local_28;
  undefined4 local_1c;
  long local_18;
  undefined4 local_c;
  long local_8;
  
  local_204 = *(int *)((long)in_RDI + 0x2c);
  local_208 = (int)in_RDI[7];
  local_210 = in_RDI[2];
  local_214 = (undefined4)in_RDI[3];
  local_218 = *(int *)(in_RSI + 0x2c);
  local_21c = *(int *)(in_RSI + 0x30);
  local_220 = local_204 * 2 + local_218 * -2;
  local_1d8 = &local_268;
  local_268 = (void *)0x0;
  local_260 = (int *)0x0;
  local_258 = 0;
  local_250 = 0;
  local_248 = (Mat *)0x0;
  local_240 = 0;
  local_23c = 0;
  local_238 = 0;
  local_234 = 0;
  local_230 = 0;
  local_228 = 0;
  local_1e0 = in_RDI;
  Mat::create(in_stack_fffffffffffffca0,(int)((ulong)in_stack_fffffffffffffc98 >> 0x20),
              (int)in_stack_fffffffffffffc98,(int)((ulong)in_stack_fffffffffffffc90 >> 0x20),
              in_stack_fffffffffffffc88,(int)((ulong)in_stack_fffffffffffffc80 >> 0x20),
              (Allocator *)in_stack_fffffffffffffd00);
  for (local_278 = 0; local_278 < local_208; local_278 = local_278 + 1) {
    local_f0 = &local_2c8;
    local_64 = *(int *)((long)local_1e0 + 0x2c);
    local_68 = (int)local_1e0[6];
    local_6c = *(undefined4 *)((long)local_1e0 + 0x34);
    local_78 = (undefined4 *)(*local_1e0 + local_1e0[8] * (long)local_278 * local_1e0[2]);
    local_80 = local_1e0[2];
    local_84 = (undefined4)local_1e0[3];
    local_90 = local_1e0[4];
    local_60 = &local_2c8;
    local_8 = (long)local_64 * (long)local_68 * local_80;
    local_108 = &local_2c8;
    local_1d0 = &local_2c8;
    local_130 = &local_318;
    local_138 = &local_268;
    local_40 = (undefined4 *)((long)local_268 + local_228 * local_278 * local_258);
    local_28 = &local_318;
    local_18 = (long)local_23c * (long)local_238 * local_258;
    local_110 = &local_318;
    local_1c0 = &local_318;
    local_290 = 0;
    local_294 = 0;
    local_298 = 0;
    local_29c = 0;
    local_2b0 = 0;
    local_2b8 = 0;
    local_2c0 = 0;
    local_2c8 = 0;
    local_c = 0x10;
    local_1c = 0x10;
    local_2c = local_23c;
    local_30 = local_238;
    local_34 = local_234;
    local_48 = local_258;
    local_4c = local_250;
    local_58 = local_248;
    local_fc = local_278;
    local_fd = 1;
    local_13c = local_278;
    local_13d = 1;
    local_288 = 0;
    local_2a0 = 0;
    local_318 = 0;
    in_stack_fffffffffffffcf8 = (Mat *)0x0;
    uVar1 = 0;
    in_stack_fffffffffffffd10 = 0;
    in_stack_fffffffffffffd14 = 0;
    in_stack_fffffffffffffcf0 = (Option *)0x0;
    local_2d0 = local_40;
    local_280 = local_78;
    for (local_31c = 0; local_31c < local_21c; local_31c = local_31c + 1) {
      for (local_320 = 0; local_320 < local_218; local_320 = local_320 + 1) {
        *local_2d0 = *local_280;
        local_280 = local_280 + 2;
        local_2d0 = local_2d0 + 1;
      }
      local_280 = local_280 + local_220;
    }
    in_stack_fffffffffffffd08 = local_248;
    local_168 = local_1c0;
    local_148 = local_1d0;
    local_2a8 = local_90;
  }
  conv1x1s1_sgemm_pack1to4_sse
            ((Mat *)CONCAT44(in_stack_fffffffffffffd14,in_stack_fffffffffffffd10),
             in_stack_fffffffffffffd08,in_stack_fffffffffffffd00,in_stack_fffffffffffffcf8,
             in_stack_fffffffffffffcf0);
  local_1b0 = &local_268;
  if (local_260 != (int *)0x0) {
    local_18c = 0xffffffff;
    LOCK();
    local_190 = *local_260;
    *local_260 = *local_260 + -1;
    UNLOCK();
    if (local_190 == 1) {
      local_188 = local_1b0;
      if (local_248 == (Mat *)0x0) {
        local_a0 = local_268;
        if (local_268 != (void *)0x0) {
          free(local_268);
        }
      }
      else {
        (**(code **)((long)local_248->data + 0x18))(local_248,local_268);
      }
    }
  }
  return;
}

Assistant:

static void conv1x1s2_sgemm_pack1to4_sse(const Mat& bottom_blob, Mat& top_blob, const Mat& kernel, const Mat& _bias, const Option& opt)
{
    int w = bottom_blob.w;
    int channels = bottom_blob.c;
    size_t elemsize = bottom_blob.elemsize;
    int elempack = bottom_blob.elempack;

    int outw = top_blob.w;
    int outh = top_blob.h;

    const int tailstep = w - 2 * outw + w;

    Mat bottom_blob_shrinked;
    bottom_blob_shrinked.create(outw, outh, channels, elemsize, elempack, opt.workspace_allocator);

    #pragma omp parallel for num_threads(opt.num_threads)
    for (int p = 0; p < channels; p++)
    {
        const float* r0 = bottom_blob.channel(p);
        float* outptr = bottom_blob_shrinked.channel(p);

        for (int i = 0; i < outh; i++)
        {
            for (int j = 0; j < outw; j++)
            {
                outptr[0] = r0[0];

                r0 += 2;
                outptr += 1;
            }

            r0 += tailstep;
        }
    }

    conv1x1s1_sgemm_pack1to4_sse(bottom_blob_shrinked, top_blob, kernel, _bias, opt);
}